

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncCos<Fad<double>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadFuncCos<Fad<double>_>_>::dx(in_RDI,in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                     0x1722cd7);
  vVar3 = FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::dx
                    ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                     in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadFuncCos<Fad<double>_>_>::val((FadExpr<FadFuncCos<Fad<double>_>_> *)0x1722d02);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}